

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int get_sleb128(int32_t *pval,uint8_t *buf,uint8_t *buf_end)

{
  int iVar1;
  byte bVar2;
  uint8_t *ptr;
  uint8_t *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  
  iVar1 = -1;
  if (buf < buf_end) {
    puVar3 = buf + 1;
    bVar2 = 0;
    uVar6 = 0;
    uVar4 = 0;
    do {
      uVar4 = (puVar3[-1] & 0x7f) << (bVar2 & 0x1f) | uVar4;
      if (-1 < (char)puVar3[-1]) {
        if ((int)(uVar6 + 1) < 0) goto LAB_0010d467;
        uVar5 = -(uVar4 & 1) ^ uVar4 >> 1;
        iVar1 = uVar6 + 1;
        break;
      }
      bVar7 = uVar6 < 4;
      uVar6 = uVar6 + 1;
      bVar8 = puVar3 < buf_end;
      bVar2 = bVar2 + 7;
      puVar3 = puVar3 + 1;
      uVar5 = 0;
    } while (bVar8 && bVar7);
  }
  else {
LAB_0010d467:
    uVar5 = 0;
  }
  *pval = uVar5;
  return iVar1;
}

Assistant:

static int get_sleb128(int32_t *pval, const uint8_t *buf,
                       const uint8_t *buf_end)
{
    int ret;
    uint32_t val;
    ret = get_leb128(&val, buf, buf_end);
    if (ret < 0) {
        *pval = 0;
        return -1;
    }
    *pval = (val >> 1) ^ -(val & 1);
    return ret;
}